

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cpp
# Opt level: O3

bool fs_is_safe_char(char c)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int __c;
  undefined7 in_register_00000039;
  
  __c = (int)CONCAT71(in_register_00000039,c);
  iVar2 = isalnum(__c);
  bVar1 = true;
  if (iVar2 == 0) {
    pcVar3 = (char *)memchr("_-.~@#$%^&()[]{}+=,!",__c,0x14);
    bVar1 = pcVar3 != "" && pcVar3 != (char *)0x0;
  }
  return bVar1;
}

Assistant:

static bool
fs_is_safe_char(const char c)
{
  // unordered_set<char>  8us
  // set<char, std::less<>>  6us
  // vector<char> 0.3us so much faster!
  // <string_view>.find_first_of is same speed as vector<char> but more readable
  static constexpr std::string_view safe = "_-.~@#$%^&()[]{}+=,!";

  return std::isalnum(c) || safe.find_first_of(c) != std::string::npos;
}